

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
::~MatcherBase(MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
               *this)

{
  MatcherBase<const_phmap::node_hash_map<phmap::priv::(anonymous_namespace)::NonMovableKey,_int,_phmap::priv::(anonymous_namespace)::NonMovableKeyHash,_phmap::priv::(anonymous_namespace)::NonMovableKeyEq,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>_&>
  *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }